

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

Value * DumpCTestInfo(Value *__return_storage_ptr__,cmCTestRunTest *testRun,
                     cmCTestTestProperties *testProperties,BacktraceData *backtraceGraph)

{
  bool bVar1;
  Value *pVVar2;
  cmCTest *this;
  ulong uVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  size_type sVar4;
  undefined1 local_110 [8];
  Value properties;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commandAndArgs;
  string *command;
  String *local_70;
  string *config;
  Value local_58;
  byte local_29;
  BacktraceData *local_28;
  BacktraceData *backtraceGraph_local;
  cmCTestTestProperties *testProperties_local;
  cmCTestRunTest *testRun_local;
  Value *testInfo;
  
  local_29 = 0;
  local_28 = backtraceGraph;
  backtraceGraph_local = (BacktraceData *)testProperties;
  testProperties_local = (cmCTestTestProperties *)testRun;
  testRun_local = (cmCTestRunTest *)__return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  Json::Value::Value(&local_58,
                     (String *)
                     &(backtraceGraph_local->CommandMap)._M_h._M_rehash_policy._M_next_resize);
  pVVar2 = Json::Value::operator[](__return_storage_ptr__,"name");
  Json::Value::operator=(pVVar2,&local_58);
  Json::Value::~Value(&local_58);
  this = cmCTestRunTest::GetCTest((cmCTestRunTest *)testProperties_local);
  local_70 = cmCTest::GetConfigType_abi_cxx11_(this);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    Json::Value::Value((Value *)&command,local_70);
    pVVar2 = Json::Value::operator[](__return_storage_ptr__,"config");
    Json::Value::operator=(pVVar2,(Value *)&command);
    Json::Value::~Value((Value *)&command);
  }
  commandAndArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       cmCTestRunTest::GetActualCommand_abi_cxx11_((cmCTestRunTest *)testProperties_local);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&args);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&args,commandAndArgs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    this_00 = cmCTestRunTest::GetArguments_abi_cxx11_((cmCTestRunTest *)testProperties_local);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(this_00);
    if (!bVar1) {
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(this_00);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&args,sVar4 + 1);
      cm::
      append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&args,this_00);
    }
    DumpToJsonArray((Value *)&properties.limit_,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&args);
    pVVar2 = Json::Value::operator[](__return_storage_ptr__,"command");
    Json::Value::operator=(pVVar2,(Value *)&properties.limit_);
    Json::Value::~Value((Value *)&properties.limit_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&args);
  }
  DumpCTestProperties((Value *)local_110,(cmCTestTestProperties *)backtraceGraph_local);
  bVar1 = Json::Value::empty((Value *)local_110);
  if (!bVar1) {
    pVVar2 = Json::Value::operator[](__return_storage_ptr__,"properties");
    Json::Value::operator=(pVVar2,(Value *)local_110);
  }
  bVar1 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Empty
                    ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)
                     &backtraceGraph_local[3].FileMap._M_h._M_before_begin);
  if (!bVar1) {
    AddBacktrace(local_28,__return_storage_ptr__,
                 (cmListFileBacktrace *)&backtraceGraph_local[3].FileMap._M_h._M_before_begin);
  }
  local_29 = 1;
  Json::Value::~Value((Value *)local_110);
  if ((local_29 & 1) == 0) {
    Json::Value::~Value(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static Json::Value DumpCTestInfo(
  cmCTestRunTest& testRun,
  cmCTestTestHandler::cmCTestTestProperties& testProperties,
  BacktraceData& backtraceGraph)
{
  Json::Value testInfo = Json::objectValue;
  // test name should always be present
  testInfo["name"] = testProperties.Name;
  std::string const& config = testRun.GetCTest()->GetConfigType();
  if (!config.empty()) {
    testInfo["config"] = config;
  }
  std::string const& command = testRun.GetActualCommand();
  if (!command.empty()) {
    std::vector<std::string> commandAndArgs;
    commandAndArgs.push_back(command);
    const std::vector<std::string>& args = testRun.GetArguments();
    if (!args.empty()) {
      commandAndArgs.reserve(args.size() + 1);
      cm::append(commandAndArgs, args);
    }
    testInfo["command"] = DumpToJsonArray(commandAndArgs);
  }
  Json::Value properties = DumpCTestProperties(testProperties);
  if (!properties.empty()) {
    testInfo["properties"] = properties;
  }
  if (!testProperties.Backtrace.Empty()) {
    AddBacktrace(backtraceGraph, testInfo, testProperties.Backtrace);
  }
  return testInfo;
}